

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::CopyVertex
          (ColladaParser *this,size_t currentVertex,size_t numOffsets,size_t numPoints,
          size_t perVertexOffset,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t currentPrimitive,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *indices)

{
  pointer pInput;
  InputChannel *pInput_00;
  long lVar1;
  
  lVar1 = (numPoints * currentPrimitive + currentVertex) * numOffsets;
  if ((numOffsets + lVar1) - 1 <
      (ulong)((long)(indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    for (pInput = (pMesh->mPerVertexData).
                  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pInput != (pMesh->mPerVertexData).
                  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pInput = pInput + 1) {
      ExtractDataObjectFromChannel
                (this,pInput,
                 (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar1 + perVertexOffset],pMesh);
    }
    for (pInput_00 = (pPerIndexChannels->
                     super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        pInput_00 !=
        (pPerIndexChannels->
        super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
        )._M_impl.super__Vector_impl_data._M_finish; pInput_00 = pInput_00 + 1) {
      ExtractDataObjectFromChannel
                (this,pInput_00,
                 (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar1 + pInput_00->mOffset],pMesh);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&pMesh->mFacePosIndices,
               (indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar1 + perVertexOffset);
    return;
  }
  __assert_fail("(baseOffset + numOffsets - 1) < indices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                ,0xaaa,
                "void Assimp::ColladaParser::CopyVertex(size_t, size_t, size_t, size_t, Mesh *, std::vector<InputChannel> &, size_t, const std::vector<size_t> &)"
               );
}

Assistant:

void ColladaParser::CopyVertex(size_t currentVertex, size_t numOffsets, size_t numPoints, size_t perVertexOffset, Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels, size_t currentPrimitive, const std::vector<size_t>& indices) {
    // calculate the base offset of the vertex whose attributes we ant to copy
    size_t baseOffset = currentPrimitive * numOffsets * numPoints + currentVertex * numOffsets;

    // don't overrun the boundaries of the index list
    ai_assert((baseOffset + numOffsets - 1) < indices.size());

    // extract per-vertex channels using the global per-vertex offset
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + perVertexOffset], pMesh);
    // and extract per-index channels using there specified offset
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + it->mOffset], pMesh);

    // store the vertex-data index for later assignment of bone vertex weights
    pMesh->mFacePosIndices.push_back(indices[baseOffset + perVertexOffset]);
}